

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

bool __thiscall asl::HttpMessage::putFile(HttpMessage *this,String *path,int begin,int end)

{
  bool bVar1;
  char b;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Long x;
  undefined4 in_register_0000000c;
  size_t sVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  byte local_379;
  String local_358;
  String local_340;
  String local_328;
  String local_310;
  String local_2f8;
  String local_2e0;
  String local_2c8;
  String local_2b0;
  String local_298;
  String local_280;
  String local_268;
  String local_250;
  String local_238;
  String local_220;
  undefined1 local_208 [8];
  String head;
  undefined1 local_1e8 [4];
  int i;
  String boundary;
  String local_1b8;
  byte local_199;
  undefined1 local_198 [7];
  bool multipart;
  String local_180;
  String local_168;
  String local_150;
  String local_138;
  String local_120;
  String local_108;
  String local_f0;
  Long local_d8;
  Long size;
  String local_b8;
  byte local_99;
  String local_98;
  undefined4 local_80;
  undefined1 local_70 [8];
  File file;
  int end_local;
  int begin_local;
  String *path_local;
  HttpMessage *this_local;
  
  sVar6 = CONCAT44(in_register_0000000c,end);
  file._endian = end;
  file._68_4_ = begin;
  File::File((File *)local_70,path);
  bVar1 = File::exists((File *)local_70);
  if (bVar1) {
    local_99 = 0;
    local_379 = 0;
    if ((file._68_4_ == 0) && (local_379 = 0, file._endian == ENDIAN_BIG)) {
      asl::String::String(&local_98,"Content-Range");
      local_99 = 1;
      bVar1 = hasHeader(this,&local_98);
      local_379 = bVar1 ^ 0xff;
    }
    if ((local_99 & 1) != 0) {
      asl::String::~String(&local_98);
    }
    if ((local_379 & 1) == 0) {
      local_d8 = File::size((File *)local_70);
      if (file._endian == ENDIAN_BIG) {
        file._endian = (int)local_d8 - ENDIAN_LITTLE;
      }
      if ((((int)file._endian <= (int)file._68_4_) || ((int)file._68_4_ < 0)) ||
         (local_d8 < (int)file._endian)) {
        asl::String::String(&local_f0,"Content-Length");
        asl::String::String(&local_108,"0");
        setHeader(this,&local_f0,&local_108);
        asl::String::~String(&local_108);
        asl::String::~String(&local_f0);
        asl::String::String(&local_120,"Content-Range");
        asl::String::f(&local_138,"bytes */%lli",local_d8);
        setHeader(this,&local_120,&local_138);
        asl::String::~String(&local_138);
        asl::String::~String(&local_120);
        this_local._7_1_ = false;
        local_80 = 1;
        goto LAB_00145bd8;
      }
      asl::String::String(&local_150,"Content-Length");
      asl::String::String(&local_168,(file._endian - file._68_4_) + 1);
      setHeader(this,&local_150,&local_168);
      asl::String::~String(&local_168);
      asl::String::~String(&local_150);
      asl::String::String(&local_180,"Content-Range");
      asl::String::f((String *)local_198,"bytes %i-%i/%lli",(ulong)(uint)file._68_4_,
                     (ulong)file._endian,local_d8);
      setHeader(this,&local_180,(String *)local_198);
      asl::String::~String((String *)local_198);
      asl::String::~String(&local_180);
    }
    else {
      asl::String::String(&local_b8,"Content-Length");
      x = File::size((File *)local_70);
      asl::String::String((String *)&size,x);
      setHeader(this,&local_b8,(String *)&size);
      asl::String::~String((String *)&size);
      asl::String::~String(&local_b8);
    }
    asl::String::String((String *)((long)&boundary.field_2 + 8),"Content-Type");
    header(&local_1b8,this,(String *)((long)&boundary.field_2 + 8));
    bVar1 = asl::String::operator==(&local_1b8,"multipart/form-data");
    asl::String::~String(&local_1b8);
    asl::String::~String((String *)((long)&boundary.field_2 + 8));
    local_199 = bVar1;
    asl::String::String((String *)local_1e8);
    if ((local_199 & 1) != 0) {
      asl::String::operator=((String *)local_1e8,"-----------");
      for (head.field_2._12_4_ = 0; (int)head.field_2._12_4_ < 0x40;
          head.field_2._12_4_ = head.field_2._12_4_ + 1) {
        b = Random::operator()((Random *)random,'0','9');
        asl::String::operator+=((String *)local_1e8,b);
      }
      operator+(&local_280,"--",(String *)local_1e8);
      asl::String::operator+(&local_268,&local_280,"\r\n");
      asl::String::operator+
                (&local_250,&local_268,"Content-Disposition: form-data; name=\"files\"; filename=\""
                );
      File::name(&local_298,(File *)local_70);
      asl::String::operator+(&local_238,&local_250,&local_298);
      asl::String::operator+(&local_220,&local_238,"\"\r\n");
      asl::String::operator+
                ((String *)local_208,&local_220,"Content-Type: application/octet-stream\r\n\r\n");
      asl::String::~String(&local_220);
      asl::String::~String(&local_238);
      asl::String::~String(&local_298);
      asl::String::~String(&local_250);
      asl::String::~String(&local_268);
      asl::String::~String(&local_280);
      asl::String::String(&local_2b0,"Content-Length");
      asl::String::String(&local_2f8,"Content-Length");
      header(&local_2e0,this,&local_2f8);
      iVar2 = asl::String::operator_cast_to_int(&local_2e0);
      iVar3 = asl::String::length((String *)local_208);
      uVar4 = asl::String::length((String *)local_1e8);
      sVar6 = (size_t)uVar4;
      asl::String::String(&local_2c8,iVar2 + iVar3 + 8 + uVar4);
      setHeader(this,&local_2b0,&local_2c8);
      asl::String::~String(&local_2c8);
      asl::String::~String(&local_2e0);
      asl::String::~String(&local_2f8);
      asl::String::~String(&local_2b0);
      asl::String::String(&local_310,"Content-Type");
      operator+(&local_328,"multipart/form-data; boundary=",(String *)local_1e8);
      setHeader(this,&local_310,&local_328);
      asl::String::~String(&local_328);
      asl::String::~String(&local_310);
      write(this,(int)local_208,__buf_00,sVar6);
      asl::String::~String((String *)local_208);
    }
    sVar6 = (size_t)file._endian;
    writeFile(this,path,file._68_4_,file._endian);
    if ((local_199 & 1) != 0) {
      operator+(&local_358,"\r\n--",(String *)local_1e8);
      asl::String::operator+(&local_340,&local_358,"--\r\n");
      write(this,(int)&local_340,__buf_01,sVar6);
      asl::String::~String(&local_340);
      asl::String::~String(&local_358);
    }
    this_local._7_1_ = true;
    local_80 = 1;
    asl::String::~String((String *)local_1e8);
  }
  else {
    pcVar5 = asl::String::operator*(path);
    printf("file to upload not found %s\n",pcVar5);
    iVar2 = 0x1767b5;
    put(this,"");
    write(this,iVar2,__buf,sVar6);
    this_local._7_1_ = false;
    local_80 = 1;
  }
LAB_00145bd8:
  File::~File((File *)local_70);
  return this_local._7_1_;
}

Assistant:

bool HttpMessage::putFile(const String& path, int begin, int end)
{
	File file(path);
	if (!file.exists())
	{
		printf("file to upload not found %s\n", *path);
		put("");
		write();
		return false;
	}
	if (begin == 0 && end == 0 && !hasHeader("Content-Range"))
		setHeader("Content-Length", file.size());
	else
	{
		Long size = file.size();
		if (end == 0)
			end = int(size - 1);
		if (end <= begin || begin < 0 || end > size)
		{
			setHeader("Content-Length", "0");
			setHeader("Content-Range", String::f("bytes */%lli", size));
			return false;
		}
		setHeader("Content-Length", end - begin + 1);
		setHeader("Content-Range", String::f("bytes %i-%i/%lli", begin, end, size));
	}

	bool multipart = header("Content-Type") == "multipart/form-data";

	String boundary;

	if (multipart)
	{
		boundary = "-----------";
		for (int i = 0; i < 64; i++)
			boundary += (char)random('0', '9');

		String head = "--" + boundary + "\r\n" +
			"Content-Disposition: form-data; name=\"files\"; filename=\"" + file.name() + "\"\r\n" +
			"Content-Type: application/octet-stream\r\n\r\n";

		setHeader("Content-Length", int(header("Content-Length")) + head.length() + boundary.length() + 8);
		setHeader("Content-Type", "multipart/form-data; boundary=" + boundary);

		write(head);
	}
	writeFile(path, begin, end);
	
	if (multipart)
	{
		write("\r\n--" + boundary + "--\r\n");
	}

	return true;
}